

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

thread_record * __thiscall
cds::urcu::details::thread_list<cds::urcu::general_threaded_tag,_std::allocator<int>_>::alloc
          (thread_list<cds::urcu::general_threaded_tag,_std::allocator<int>_> *this)

{
  bool bVar1;
  __pointer_type local_88;
  thread_record *pOldHead;
  Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
  local_69;
  ThreadId local_68;
  ThreadId thId;
  ThreadId curThreadId;
  ThreadId nullThreadId;
  thread_record *pRec;
  thread_list<cds::urcu::general_threaded_tag,_std::allocator<int>_> *this_local;
  undefined1 local_31;
  ThreadId local_30;
  undefined4 local_28;
  undefined4 local_24;
  ThreadId local_20;
  ThreadId *local_18;
  ThreadId *local_10;
  
  curThreadId = 0;
  pRec = (thread_record *)this;
  thId = OS::posix::get_current_thread_id();
  nullThreadId = (ThreadId)
                 std::atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*>::
                 load((atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*> *)
                      this,memory_order_acquire);
  while( true ) {
    if (nullThreadId == 0) {
      cds::details::
      Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
      ::Allocator(&local_69);
      nullThreadId = (ThreadId)
                     cds::details::
                     Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
                     ::New<unsigned_long>(&local_69,&thId);
      cds::details::
      Allocator<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>,_std::allocator<int>_>
      ::~Allocator(&local_69);
      local_88 = std::atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*>::
                 load((atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*> *)
                      this,memory_order_acquire);
      do {
        *(__pointer_type *)(nullThreadId + 8) = local_88;
        bVar1 = std::atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*>::
                compare_exchange_weak
                          ((atomic<cds::urcu::details::thread_data<cds::urcu::general_threaded_tag>_*>
                            *)this,&local_88,(__pointer_type)nullThreadId,memory_order_release,
                           memory_order_acquire);
      } while (((bVar1 ^ 0xffU) & 1) != 0);
      return (thread_record *)nullThreadId;
    }
    local_10 = (ThreadId *)(nullThreadId + 0x10);
    local_18 = &local_68;
    local_20 = thId;
    local_24 = 2;
    local_28 = 0;
    local_30 = thId;
    LOCK();
    local_68 = *local_10;
    local_31 = local_68 == 0;
    if ((bool)local_31) {
      *local_10 = thId;
      local_68 = 0;
    }
    UNLOCK();
    if ((bool)local_31) break;
    nullThreadId = *(ThreadId *)(nullThreadId + 8);
  }
  return (thread_record *)nullThreadId;
}

Assistant:

thread_record * alloc()
                {
                    thread_record * pRec;
                    cds::OS::ThreadId const nullThreadId = cds::OS::c_NullThreadId;
                    cds::OS::ThreadId const curThreadId  = cds::OS::get_current_thread_id();

                    // First, try to reuse a retired (non-active) HP record
                    for ( pRec = m_pHead.load( atomics::memory_order_acquire ); pRec; pRec = pRec->m_list.next_ ) {
                        cds::OS::ThreadId thId = nullThreadId;
                        if ( !pRec->m_list.thread_id_.compare_exchange_strong( thId, curThreadId, atomics::memory_order_acquire, atomics::memory_order_relaxed ))
                            continue;
                        return pRec;
                    }

                    // No records available for reuse
                    // Allocate and push a new record
                    pRec = allocator_type().New( curThreadId );

                    thread_record * pOldHead = m_pHead.load( atomics::memory_order_acquire );
                    do {
                        // Compiler barriers: assignment MUST BE inside the loop
                        CDS_COMPILER_RW_BARRIER;
                        pRec->m_list.next_ = pOldHead;
                        CDS_COMPILER_RW_BARRIER;
                    } while ( !m_pHead.compare_exchange_weak( pOldHead, pRec, atomics::memory_order_release, atomics::memory_order_acquire ));

                    return pRec;
                }